

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

ExpressionValue * __thiscall
ExpressionValue::operator+
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  StringLiteral *this_00;
  ExpressionValueType EVar1;
  string *this_01;
  double dVar2;
  double in_stack_ffffffffffffff18;
  StringLiteral local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  EVar1 = this->type << 2 | other->type;
  if (10 < EVar1 - 5) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->strValue;
  switch(EVar1) {
  case 5:
    __return_storage_ptr__->type = Integer;
    (__return_storage_ptr__->field_1).intValue =
         (other->field_1).intValue + (this->field_1).intValue;
    return __return_storage_ptr__;
  case 6:
    __return_storage_ptr__->type = Float;
    dVar2 = (double)(this->field_1).intValue;
    goto LAB_0016914e;
  case 7:
    __return_storage_ptr__->type = String;
    (anonymous_namespace)::to_string_abi_cxx11_((int64_t)in_stack_ffffffffffffff18);
    StringLiteral::StringLiteral(&local_e0,&local_40);
    StringLiteral::operator+((StringLiteral *)&local_c0,&local_e0,&other->strValue);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    this_01 = &local_40;
    break;
  default:
    goto switchD_00168f57_caseD_8;
  case 9:
    __return_storage_ptr__->type = Float;
    dVar2 = (double)(other->field_1).intValue + (this->field_1).floatValue;
    goto LAB_00169154;
  case 10:
    __return_storage_ptr__->type = Float;
    dVar2 = (this->field_1).floatValue;
LAB_0016914e:
    dVar2 = dVar2 + (other->field_1).floatValue;
LAB_00169154:
    (__return_storage_ptr__->field_1).floatValue = dVar2;
    return __return_storage_ptr__;
  case 0xb:
    __return_storage_ptr__->type = String;
    (anonymous_namespace)::to_string_abi_cxx11_(in_stack_ffffffffffffff18);
    StringLiteral::StringLiteral(&local_e0,&local_60);
    StringLiteral::operator+((StringLiteral *)&local_c0,&local_e0,&other->strValue);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    this_01 = &local_60;
    break;
  case 0xd:
    __return_storage_ptr__->type = String;
    (anonymous_namespace)::to_string_abi_cxx11_((int64_t)in_stack_ffffffffffffff18);
    StringLiteral::StringLiteral(&local_e0,&local_80);
    StringLiteral::operator+((StringLiteral *)&local_c0,&this->strValue,&local_e0);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    this_01 = &local_80;
    break;
  case 0xe:
    __return_storage_ptr__->type = String;
    (anonymous_namespace)::to_string_abi_cxx11_(in_stack_ffffffffffffff18);
    StringLiteral::StringLiteral(&local_e0,&local_a0);
    StringLiteral::operator+((StringLiteral *)&local_c0,&this->strValue,&local_e0);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    this_01 = &local_a0;
    break;
  case 0xf:
    __return_storage_ptr__->type = String;
    StringLiteral::operator+((StringLiteral *)&local_c0,&this->strValue,&other->strValue);
    this_01 = &local_c0;
    std::__cxx11::string::operator=((string *)this_00,(string *)this_01);
  }
  std::__cxx11::string::~string((string *)this_01);
switchD_00168f57_caseD_8:
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator+(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		result.intValue = intValue + other.intValue;
		break;
	case ExpressionValueCombination::FI:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue + other.intValue;
		break;
	case ExpressionValueCombination::IF:
		result.type = ExpressionValueType::Float;
		result.floatValue = intValue + other.floatValue;
		break;
	case ExpressionValueCombination::FF:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue + other.floatValue;
		break;
	case ExpressionValueCombination::IS:
		result.type = ExpressionValueType::String;
		result.strValue = StringLiteral(to_string(intValue)) + other.strValue;
		break;
	case ExpressionValueCombination::FS:
		result.type = ExpressionValueType::String;
		result.strValue = StringLiteral(to_string(floatValue)) + other.strValue;
		break;
	case ExpressionValueCombination::SI:
		result.type = ExpressionValueType::String;
		result.strValue = strValue + to_string(other.intValue);
		break;
	case ExpressionValueCombination::SF:
		result.type = ExpressionValueType::String;
		result.strValue = strValue + to_string(other.floatValue);
		break;
	case ExpressionValueCombination::SS:
		result.type = ExpressionValueType::String;
		result.strValue = strValue + other.strValue;
		break;
	}

	return result;
}